

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryJoin(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Type TVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *this;
  JavascriptString *pJVar9;
  int in_stack_00000010;
  CallInfo local_68;
  CallInfo callInfo_local;
  ArgumentReader args;
  JsReentLock jsReentLock;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_68 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_68._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1181,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b845dd;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = local_68;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_68);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)pSVar1->threadContext;
  bVar3 = ((ThreadContext *)args.super_Arguments.Values)->noJsReentrancy;
  ((ThreadContext *)args.super_Arguments.Values)->noJsReentrancy = true;
  if (((ulong)local_68 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1185,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b845dd;
    *puVar7 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.join");
  }
  pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&args.super_Arguments.Values,pvVar8);
  if (((ulong)callInfo_local & 0xfffffe) == 0) {
    pJVar9 = StringCache::GetCommaDisplay
                       (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->stringCache);
    goto LAB_00b8459b;
  }
  pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  if (pvVar8 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00b845dd;
    *puVar7 = 0;
  }
  if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00b845dd;
    *puVar7 = 0;
  }
  if ((ulong)pvVar8 >> 0x32 == 0 && ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b845dd;
      *puVar7 = 0;
    }
    TVar6 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar6) {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00b845dd:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      goto LAB_00b84532;
    }
  }
  else {
LAB_00b84532:
    TVar6 = TypeIds_FirstNumberType;
  }
  if (TVar6 == TypeIds_Undefined) {
    pJVar9 = StringCache::GetCommaDisplay
                       (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    *(bool *)(args.super_Arguments.Values + 0x21) = bVar3;
    pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    pJVar9 = JavascriptConversion::ToString(pvVar8,pSVar1);
    JsReentLock::MutateArrayObject((JsReentLock *)&args.super_Arguments.Values);
    *(undefined1 *)(args.super_Arguments.Values + 0x21) = 1;
  }
LAB_00b8459b:
  *(bool *)(args.super_Arguments.Values + 0x21) = bVar3;
  pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  pJVar9 = JoinHelper(pvVar8,pJVar9,pSVar1);
  *(bool *)(args.super_Arguments.Values + 0x21) = bVar3;
  return pJVar9;
}

Assistant:

Var JavascriptArray::EntryJoin(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Join);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.join"));
        }

        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        JavascriptString* separator;
        if (args.Info.Count >= 2)
        {
            TypeId typeId = JavascriptOperators::GetTypeId(args[1]);
            //ES5 15.4.4.5 If separator is undefined, let separator be the single-character String ",".
            if (TypeIds_Undefined != typeId)
            {
                JS_REENTRANT(jsReentLock, separator = JavascriptConversion::ToString(args[1], scriptContext));
            }
            else
            {
                separator = scriptContext->GetLibrary()->GetCommaDisplayString();
            }
        }
        else
        {
            separator = scriptContext->GetLibrary()->GetCommaDisplayString();
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JoinHelper(args[0], separator, scriptContext));
        JIT_HELPER_END(Array_Join);
    }